

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall
TFileNameDatabase::SetChildDatabase(TFileNameDatabase *this,TFileNameDatabase *pNewDB)

{
  TFileNameDatabase *this_00;
  TFileNameDatabase *pNewDB_local;
  TFileNameDatabase *this_local;
  
  if ((pNewDB == (TFileNameDatabase *)0x0) || (this->pChildDB != pNewDB)) {
    if ((this->pChildDB != (TFileNameDatabase *)0x0) &&
       (this_00 = this->pChildDB, this_00 != (TFileNameDatabase *)0x0)) {
      ~TFileNameDatabase(this_00);
      operator_delete(this_00,0x248);
    }
    this->pChildDB = pNewDB;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 0x16;
  }
  return this_local._4_4_;
}

Assistant:

int SetChildDatabase(TFileNameDatabase * pNewDB)
    {
        if(pNewDB != NULL && pChildDB == pNewDB)
            return ERROR_INVALID_PARAMETER;

        if(pChildDB != NULL)
            delete pChildDB;
        pChildDB = pNewDB;
        return ERROR_SUCCESS;
    }